

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

string * __thiscall
cmTarget::ProcessSourceItemCMP0049(string *__return_storage_ptr__,cmTarget *this,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  ostream *poVar7;
  PolicyID id;
  MessageType t;
  string src;
  ostringstream e;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  paVar1 = &local_1e8.field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + s->_M_string_length);
  cmMakefile::ExpandVariablesInString(this->Makefile,&local_1e8);
  if (local_1e8._M_string_length == s->_M_string_length) {
    if (local_1e8._M_string_length != 0) {
      iVar5 = bcmp(local_1e8._M_dataplus._M_p,(s->_M_dataplus)._M_p,local_1e8._M_string_length);
      if (iVar5 != 0) goto LAB_003108ed;
    }
  }
  else {
LAB_003108ed:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    PVar6 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0049);
    if (PVar6 - NEW < 3) {
      t = FATAL_ERROR;
      bVar4 = true;
      bVar3 = false;
    }
    else {
      if (PVar6 == OLD) {
        bVar3 = true;
      }
      else {
        bVar3 = false;
        bVar4 = false;
        t = AUTHOR_WARNING;
        if (PVar6 != WARN) goto LAB_00310992;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x31,id);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                            local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        bVar3 = false;
      }
      bVar4 = false;
      t = AUTHOR_WARNING;
    }
LAB_00310992:
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Legacy variable expansion in source file \"",0x2a);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(s->_M_dataplus)._M_p,s->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" expanded to \"",0xf);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" in target \"",0xd);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\".  This behavior will be removed in a future version of CMake.",0x3f);
      this_00 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,t,&local_1c8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        goto LAB_00310b09;
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,local_1e8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1e8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1e8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,local_1e8.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_1e8._M_string_length;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
LAB_00310b09:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::ProcessSourceItemCMP0049(const std::string& s)
{
  std::string src = s;

  // For backwards compatibility replace varibles in source names.
  // This should eventually be removed.
  this->Makefile->ExpandVariablesInString(src);
  if (src != s)
    {
    std::ostringstream e;
    bool noMessage = false;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0049))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0049) << "\n";
        break;
      case cmPolicies::OLD:
        noMessage = true;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = cmake::FATAL_ERROR;
      }
    if (!noMessage)
      {
      e << "Legacy variable expansion in source file \""
        << s << "\" expanded to \"" << src << "\" in target \""
        << this->GetName() << "\".  This behavior will be removed in a "
        "future version of CMake.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR)
        {
        return "";
        }
      }
    }
  return src;
}